

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

curl_off_t encoder_base64_size(curl_mimepart *part)

{
  long lVar1;
  curl_off_t size;
  curl_mimepart *part_local;
  
  part_local = (curl_mimepart *)part->datasize;
  if (0 < (long)part_local) {
    lVar1 = ((long)((long)&part_local[-1].lastreadstatus + 7) / 3 + 1) * 4;
    part_local = (curl_mimepart *)(lVar1 + ((lVar1 + -1) / 0x4c) * 2);
  }
  return (curl_off_t)part_local;
}

Assistant:

static curl_off_t encoder_base64_size(curl_mimepart *part)
{
  curl_off_t size = part->datasize;

  if(size <= 0)
    return size;    /* Unknown size or no data. */

  /* Compute base64 character count. */
  size = 4 * (1 + (size - 1) / 3);

  /* Effective character count must include CRLFs. */
  return size + 2 * ((size - 1) / MAX_ENCODED_LINE_LENGTH);
}